

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O1

void sha512_sw_write(BinarySink *bs,void *vp,size_t len)

{
  BinarySink **ppBVar1;
  ulong uVar2;
  BinarySink *pBVar3;
  long lVar4;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var5;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var6;
  BinarySink *pBVar7;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var8;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var9;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var10;
  code *pcVar11;
  BinarySink *pBVar12;
  ulong uVar13;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var14;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var15;
  BinarySink **ppBVar16;
  uint64_t w [80];
  ulong auStack_338 [3];
  BinarySink **local_320;
  BinarySink *local_318;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_310;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_308;
  BinarySink *local_300;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_2f8;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_2f0;
  BinarySink *local_2e8;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_2e0;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_2d8;
  void *local_2d0;
  ulong local_2c8;
  size_t local_2c0;
  ulong local_2b8 [9];
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *ap_Stack_270 [5];
  ulong auStack_248 [67];
  
  if (len != 0) {
    ppBVar16 = &bs[-7].binarysink_;
    local_320 = ppBVar16;
    local_318 = bs;
    do {
      uVar13 = 0x80 - (long)bs[-1].write;
      if (len < uVar13) {
        uVar13 = len;
      }
      auStack_338[1] = 0x12e1bb;
      memcpy(bs[-1].write + (long)ppBVar16,vp,uVar13);
      pBVar3 = local_318;
      p_Var8 = bs[-1].write;
      bs[-1].write = p_Var8 + uVar13;
      ppBVar1 = &bs[-1].binarysink_;
      pBVar7 = *ppBVar1;
      *ppBVar1 = (BinarySink *)(&(*ppBVar1)->write + uVar13);
      bs[-1].writefmtv = bs[-1].writefmtv + CARRY8((ulong)pBVar7,uVar13 * 8);
      local_2c0 = uVar13;
      if (p_Var8 + uVar13 == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x80) {
        bs[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
        lVar4 = 0;
        do {
          uVar13 = *(ulong *)((long)bs + lVar4 * 8 + -0x98);
          local_2b8[lVar4] =
               uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
               (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
               (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28
               | uVar13 << 0x38;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        lVar4 = 0x10;
        do {
          uVar13 = auStack_338[lVar4 + 1];
          uVar2 = (&local_2c8)[lVar4];
          local_2b8[lVar4] =
               (ulong)((&local_2f0)[lVar4] +
                      (uVar2 >> 6 ^ (uVar2 << 3 | uVar2 >> 0x3d) ^ (uVar2 << 0x2d | uVar2 >> 0x13))
                      + (uVar13 >> 7 ^
                        (uVar13 << 0x38 | uVar13 >> 8) ^
                        (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) + auStack_338[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x50);
        local_310 = bs[-9].write;
        local_308 = bs[-9].writefmtv;
        local_300 = bs[-9].binarysink_;
        local_2f8 = bs[-8].write;
        local_2f0 = bs[-8].writefmtv;
        local_2e8 = bs[-8].binarysink_;
        local_2e0 = bs[-7].write;
        local_2d8 = bs[-7].writefmtv;
        uVar13 = 0xfffffffffffffff8;
        p_Var5 = local_308;
        pBVar7 = local_300;
        p_Var8 = local_2e0;
        p_Var9 = local_310;
        p_Var10 = local_2d8;
        pBVar12 = local_2e8;
        p_Var14 = local_2f0;
        p_Var15 = local_2f8;
        do {
          p_Var15 = p_Var15 + (long)(p_Var10 +
                                    local_2b8[uVar13 + 8] +
                                    sha512_round_constants[uVar13 + 8] +
                                    (((long)p_Var14 << 0x17 | (ulong)p_Var14 >> 0x29) ^
                                    ((long)p_Var14 << 0x2e | (ulong)p_Var14 >> 0x12) ^
                                    ((long)p_Var14 << 0x32 | (ulong)p_Var14 >> 0xe)) +
                                    (((ulong)pBVar12 ^ (ulong)p_Var8) & (ulong)p_Var14 ^
                                    (ulong)p_Var8));
          p_Var10 = p_Var10 + local_2b8[uVar13 + 8] +
                              sha512_round_constants[uVar13 + 8] +
                              (((long)p_Var14 << 0x17 | (ulong)p_Var14 >> 0x29) ^
                              ((long)p_Var14 << 0x2e | (ulong)p_Var14 >> 0x12) ^
                              ((long)p_Var14 << 0x32 | (ulong)p_Var14 >> 0xe)) +
                              (((ulong)pBVar12 ^ (ulong)p_Var8) & (ulong)p_Var14 ^ (ulong)p_Var8) +
                    (((ulong)p_Var9 | (ulong)p_Var5) & (ulong)pBVar7 | (ulong)p_Var9 & (ulong)p_Var5
                    ) + (((long)p_Var9 << 0x19 | (ulong)p_Var9 >> 0x27) ^
                        ((long)p_Var9 << 0x1e | (ulong)p_Var9 >> 0x22) ^
                        ((long)p_Var9 << 0x24 | (ulong)p_Var9 >> 0x1c));
          p_Var6 = (_func_void_BinarySink_ptr_void_ptr_size_t *)
                   ((long)&pBVar7->write +
                   (long)(p_Var8 + (((long)p_Var15 * 0x800000 | (ulong)p_Var15 >> 0x29) ^
                                   ((long)p_Var15 << 0x2e | (ulong)p_Var15 >> 0x12) ^
                                   ((long)p_Var15 << 0x32 | (ulong)p_Var15 >> 0xe)) +
                                   (((ulong)p_Var14 ^ (ulong)pBVar12) & (ulong)p_Var15 ^
                                   (ulong)pBVar12) +
                                   local_2b8[uVar13 + 9] + sha512_round_constants[uVar13 + 9]));
          p_Var8 = p_Var8 + (((long)p_Var15 * 0x800000 | (ulong)p_Var15 >> 0x29) ^
                            ((long)p_Var15 << 0x2e | (ulong)p_Var15 >> 0x12) ^
                            ((long)p_Var15 << 0x32 | (ulong)p_Var15 >> 0xe)) +
                            (((ulong)p_Var14 ^ (ulong)pBVar12) & (ulong)p_Var15 ^ (ulong)pBVar12) +
                            local_2b8[uVar13 + 9] + sha512_round_constants[uVar13 + 9] +
                   (((ulong)p_Var10 | (ulong)p_Var9) & (ulong)p_Var5 |
                   (ulong)p_Var10 & (ulong)p_Var9) +
                   (((long)p_Var10 * 0x2000000 | (ulong)p_Var10 >> 0x27) ^
                   ((long)p_Var10 * 0x40000000 | (ulong)p_Var10 >> 0x22) ^
                   ((long)p_Var10 << 0x24 | (ulong)p_Var10 >> 0x1c));
          pcVar11 = (code *)((long)&pBVar12->write +
                            (((long)p_Var6 * 0x800000 | (ulong)p_Var6 >> 0x29) ^
                            ((long)p_Var6 << 0x2e | (ulong)p_Var6 >> 0x12) ^
                            ((long)p_Var6 << 0x32 | (ulong)p_Var6 >> 0xe)) +
                            (((ulong)p_Var15 ^ (ulong)p_Var14) & (ulong)p_Var6 ^ (ulong)p_Var14) +
                            local_2b8[uVar13 + 10] + sha512_round_constants[uVar13 + 10]);
          p_Var5 = p_Var5 + (long)pcVar11;
          pcVar11 = pcVar11 + (((ulong)p_Var8 | (ulong)p_Var10) & (ulong)p_Var9 |
                              (ulong)p_Var8 & (ulong)p_Var10) +
                              (((long)p_Var8 * 0x2000000 | (ulong)p_Var8 >> 0x27) ^
                              ((long)p_Var8 * 0x40000000 | (ulong)p_Var8 >> 0x22) ^
                              ((long)p_Var8 << 0x24 | (ulong)p_Var8 >> 0x1c));
          p_Var9 = p_Var9 + (long)(p_Var14 +
                                  (((long)p_Var5 * 0x800000 | (ulong)p_Var5 >> 0x29) ^
                                  ((long)p_Var5 << 0x2e | (ulong)p_Var5 >> 0x12) ^
                                  ((long)p_Var5 << 0x32 | (ulong)p_Var5 >> 0xe)) +
                                  (((ulong)p_Var6 ^ (ulong)p_Var15) & (ulong)p_Var5 ^ (ulong)p_Var15
                                  ) + local_2b8[uVar13 + 0xb] + sha512_round_constants[uVar13 + 0xb]
                                  );
          p_Var14 = p_Var14 + (((long)p_Var5 * 0x800000 | (ulong)p_Var5 >> 0x29) ^
                              ((long)p_Var5 << 0x2e | (ulong)p_Var5 >> 0x12) ^
                              ((long)p_Var5 << 0x32 | (ulong)p_Var5 >> 0xe)) +
                              (((ulong)p_Var6 ^ (ulong)p_Var15) & (ulong)p_Var5 ^ (ulong)p_Var15) +
                              local_2b8[uVar13 + 0xb] + sha512_round_constants[uVar13 + 0xb] +
                    (((ulong)pcVar11 | (ulong)p_Var8) & (ulong)p_Var10 |
                    (ulong)pcVar11 & (ulong)p_Var8) +
                    (((long)pcVar11 * 0x2000000 | (ulong)pcVar11 >> 0x27) ^
                    ((long)pcVar11 * 0x40000000 | (ulong)pcVar11 >> 0x22) ^
                    ((long)pcVar11 << 0x24 | (ulong)pcVar11 >> 0x1c));
          p_Var10 = p_Var10 + (long)(p_Var15 +
                                    (((long)p_Var9 * 0x800000 | (ulong)p_Var9 >> 0x29) ^
                                    ((long)p_Var9 << 0x2e | (ulong)p_Var9 >> 0x12) ^
                                    ((long)p_Var9 << 0x32 | (ulong)p_Var9 >> 0xe)) +
                                    (((ulong)p_Var5 ^ (ulong)p_Var6) & (ulong)p_Var9 ^ (ulong)p_Var6
                                    ) + local_2b8[uVar13 + 0xc] +
                                        sha512_round_constants[uVar13 + 0xc]);
          p_Var15 = p_Var15 + (((long)p_Var9 * 0x800000 | (ulong)p_Var9 >> 0x29) ^
                              ((long)p_Var9 << 0x2e | (ulong)p_Var9 >> 0x12) ^
                              ((long)p_Var9 << 0x32 | (ulong)p_Var9 >> 0xe)) +
                              (((ulong)p_Var5 ^ (ulong)p_Var6) & (ulong)p_Var9 ^ (ulong)p_Var6) +
                              local_2b8[uVar13 + 0xc] + sha512_round_constants[uVar13 + 0xc] +
                    (((ulong)p_Var14 | (ulong)pcVar11) & (ulong)p_Var8 |
                    (ulong)p_Var14 & (ulong)pcVar11) +
                    (((long)p_Var14 * 0x2000000 | (ulong)p_Var14 >> 0x27) ^
                    ((long)p_Var14 * 0x40000000 | (ulong)p_Var14 >> 0x22) ^
                    ((long)p_Var14 << 0x24 | (ulong)p_Var14 >> 0x1c));
          p_Var8 = p_Var8 + (long)(p_Var6 + (((long)p_Var10 * 0x800000 | (ulong)p_Var10 >> 0x29) ^
                                            ((long)p_Var10 << 0x2e | (ulong)p_Var10 >> 0x12) ^
                                            ((long)p_Var10 << 0x32 | (ulong)p_Var10 >> 0xe)) +
                                            (((ulong)p_Var9 ^ (ulong)p_Var5) & (ulong)p_Var10 ^
                                            (ulong)p_Var5) +
                                            local_2b8[uVar13 + 0xd] +
                                            sha512_round_constants[uVar13 + 0xd]);
          pBVar7 = (BinarySink *)
                   (p_Var6 + (((long)p_Var10 * 0x800000 | (ulong)p_Var10 >> 0x29) ^
                             ((long)p_Var10 << 0x2e | (ulong)p_Var10 >> 0x12) ^
                             ((long)p_Var10 << 0x32 | (ulong)p_Var10 >> 0xe)) +
                             (((ulong)p_Var9 ^ (ulong)p_Var5) & (ulong)p_Var10 ^ (ulong)p_Var5) +
                             local_2b8[uVar13 + 0xd] + sha512_round_constants[uVar13 + 0xd] +
                   (((ulong)p_Var15 | (ulong)p_Var14) & (ulong)pcVar11 |
                   (ulong)p_Var15 & (ulong)p_Var14) +
                   (((long)p_Var15 * 0x2000000 | (ulong)p_Var15 >> 0x27) ^
                   ((long)p_Var15 * 0x40000000 | (ulong)p_Var15 >> 0x22) ^
                   ((long)p_Var15 << 0x24 | (ulong)p_Var15 >> 0x1c)));
          pBVar12 = (BinarySink *)
                    (p_Var5 + (((long)p_Var8 * 0x800000 | (ulong)p_Var8 >> 0x29) ^
                              ((long)p_Var8 << 0x2e | (ulong)p_Var8 >> 0x12) ^
                              ((long)p_Var8 << 0x32 | (ulong)p_Var8 >> 0xe)) +
                              (((ulong)p_Var10 ^ (ulong)p_Var9) & (ulong)p_Var8 ^ (ulong)p_Var9) +
                              local_2b8[uVar13 + 0xe] + sha512_round_constants[uVar13 + 0xe] +
                    (long)pcVar11);
          p_Var5 = p_Var5 + (((long)p_Var8 * 0x800000 | (ulong)p_Var8 >> 0x29) ^
                            ((long)p_Var8 << 0x2e | (ulong)p_Var8 >> 0x12) ^
                            ((long)p_Var8 << 0x32 | (ulong)p_Var8 >> 0xe)) +
                            (((ulong)p_Var10 ^ (ulong)p_Var9) & (ulong)p_Var8 ^ (ulong)p_Var9) +
                            local_2b8[uVar13 + 0xe] + sha512_round_constants[uVar13 + 0xe] +
                   (((ulong)pBVar7 | (ulong)p_Var15) & (ulong)p_Var14 |
                   (ulong)pBVar7 & (ulong)p_Var15) +
                   (((long)pBVar7 * 0x2000000 | (ulong)pBVar7 >> 0x27) ^
                   ((long)pBVar7 * 0x40000000 | (ulong)pBVar7 >> 0x22) ^
                   ((long)pBVar7 << 0x24 | (ulong)pBVar7 >> 0x1c));
          p_Var14 = p_Var14 + (long)(p_Var9 + (((long)pBVar12 * 0x800000 | (ulong)pBVar12 >> 0x29) ^
                                              ((long)pBVar12 << 0x2e | (ulong)pBVar12 >> 0x12) ^
                                              ((long)pBVar12 << 0x32 | (ulong)pBVar12 >> 0xe)) +
                                              (((ulong)p_Var8 ^ (ulong)p_Var10) & (ulong)pBVar12 ^
                                              (ulong)p_Var10) +
                                              local_2b8[uVar13 + 0xf] +
                                              sha512_round_constants[uVar13 + 0xf]);
          p_Var9 = p_Var9 + (((long)pBVar12 * 0x800000 | (ulong)pBVar12 >> 0x29) ^
                            ((long)pBVar12 << 0x2e | (ulong)pBVar12 >> 0x12) ^
                            ((long)pBVar12 << 0x32 | (ulong)pBVar12 >> 0xe)) +
                            (((ulong)p_Var8 ^ (ulong)p_Var10) & (ulong)pBVar12 ^ (ulong)p_Var10) +
                            local_2b8[uVar13 + 0xf] + sha512_round_constants[uVar13 + 0xf] +
                   (((ulong)p_Var5 | (ulong)pBVar7) & (ulong)p_Var15 | (ulong)p_Var5 & (ulong)pBVar7
                   ) + (((long)p_Var5 * 0x2000000 | (ulong)p_Var5 >> 0x27) ^
                       ((long)p_Var5 * 0x40000000 | (ulong)p_Var5 >> 0x22) ^
                       ((long)p_Var5 << 0x24 | (ulong)p_Var5 >> 0x1c));
          uVar13 = uVar13 + 8;
        } while (uVar13 < 0x48);
        local_318[-9].write = p_Var9 + (long)local_310;
        local_318[-9].writefmtv = p_Var5 + (long)local_308;
        local_318[-9].binarysink_ = (BinarySink *)((long)&local_300->write + (long)&pBVar7->write);
        local_318[-8].write = p_Var15 + (long)local_2f8;
        local_318[-8].writefmtv = p_Var14 + (long)local_2f0;
        local_318[-8].binarysink_ = (BinarySink *)((long)&local_2e8->write + (long)&pBVar12->write);
        local_318[-7].write = p_Var8 + (long)local_2e0;
        local_318[-7].writefmtv = p_Var10 + (long)local_2d8;
        auStack_338[1] = 0x12e6f8;
        local_2d0 = vp;
        local_2c8 = len;
        smemclr(local_2b8,0x280);
        len = local_2c8;
        bs = pBVar3;
        vp = local_2d0;
        ppBVar16 = local_320;
      }
      vp = (void *)((long)vp + local_2c0);
      len = len - local_2c0;
    } while (len != 0);
  }
  return;
}

Assistant:

static void sha512_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha512_sw *s = BinarySink_DOWNCAST(bs, sha512_sw);

    while (len > 0)
        if (sha512_block_write(&s->blk, &vp, &len))
            sha512_sw_block(s->core, s->blk.block);
}